

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ssls.c
# Opt level: O3

CURLcode tool_ssls_save(GlobalConfig *global,OperationConfig *config,CURLSH *share,char *filename)

{
  CURL *pCVar1;
  CURLcode CVar2;
  CURL *easy;
  tool_ssls_ctx ctx;
  CURL *local_40;
  GlobalConfig *local_38;
  FILE *local_30;
  undefined4 local_28;
  
  local_40 = (CURL *)0x0;
  local_28 = 0;
  local_38 = global;
  local_30 = fopen64(filename,"w");
  if (local_30 == (FILE *)0x0) {
    CVar2 = CURLE_OK;
    warnf(global,"Warning: Failed to create SSL session file %s",filename);
  }
  else {
    CVar2 = tool_ssls_easy(global,config,share,&local_40);
    pCVar1 = local_40;
    if (CVar2 == CURLE_OK) {
      CVar2 = curl_easy_ssls_export(local_40,tool_ssls_exp,&local_38);
    }
    if (pCVar1 != (CURL *)0x0) {
      curl_easy_cleanup(pCVar1);
    }
    if (local_30 != (FILE *)0x0) {
      fclose(local_30);
    }
  }
  return CVar2;
}

Assistant:

CURLcode tool_ssls_save(struct GlobalConfig *global,
                        struct OperationConfig *config,
                        CURLSH *share, const char *filename)
{
  struct tool_ssls_ctx ctx;
  CURL *easy = NULL;
  CURLcode r = CURLE_OK;

  ctx.global = global;
  ctx.exported = 0;
  ctx.fp = fopen(filename, FOPEN_WRITETEXT);
  if(!ctx.fp) {
    warnf(global, "Warning: Failed to create SSL session file %s", filename);
    goto out;
  }

  r = tool_ssls_easy(global, config, share, &easy);
  if(r)
    goto out;

  r = curl_easy_ssls_export(easy, tool_ssls_exp, &ctx);

out:
  if(easy)
    curl_easy_cleanup(easy);
  if(ctx.fp)
    fclose(ctx.fp);
  return r;
}